

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O2

void JitFFI::SysV64::CreateCaller
               (JitFuncCreater *jfc,ArgumentInfo *argumentinfo,void *func,ArgDataList *adlist)

{
  StructBaseData SVar1;
  ushort uVar2;
  _List_node_base *dat;
  JitFuncCreater *jfc_00;
  bool bVar3;
  PassData *pPVar4;
  uint64_t uVar5;
  uint uVar6;
  OP op;
  size_t n;
  _List_node_base *p_Var7;
  uint uVar8;
  OP type;
  uint64_t local_b0;
  ArgTypeInfo *local_a8;
  void *local_a0;
  JitFuncCreater *local_98;
  UPtrValVector<JitFFI::SysV64::ArgTypeInfo::PassData> *local_90;
  ArgumentList list;
  JitFuncCallerCreater local_58;
  
  if (0xfffffffe <
      (adlist->super__List_base<const_void_*,_std::allocator<const_void_*>_>)._M_impl._M_node.
      _M_size) {
    __assert_fail("adlist.size() < UINT32_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                  ,0x3f6,
                  "void JitFFI::SysV64::CreateCaller(JitFuncCreater &, const ArgumentInfo &, void *, const ArgDataList &)"
                 );
  }
  local_a0 = func;
  local_98 = jfc;
  local_a8 = ArgumentInfo::data<(JitFFI::Platform)2,JitFFI::SysV64::ArgTypeInfo>(argumentinfo);
  list.datalist.data.c.
  super__List_base<JitFFI::SysV64::ArgumentList::Data,_std::allocator<JitFFI::SysV64::ArgumentList::Data>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&list;
  list.datalist.data.c.
  super__List_base<JitFFI::SysV64::ArgumentList::Data,_std::allocator<JitFFI::SysV64::ArgumentList::Data>_>
  ._M_impl._M_node._M_size = 0;
  list.counter.int_count = 0;
  list.counter.float_count = 0;
  list.counter.memory_count = 0;
  list.retdata.type = '\0';
  list.retdata.std.super_StructBaseData = (StructBaseData)0x0;
  list.retdata.size = 0;
  list.count = 0;
  p_Var7 = (adlist->super__List_base<const_void_*,_std::allocator<const_void_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  list.datalist.data.c.
  super__List_base<JitFFI::SysV64::ArgumentList::Data,_std::allocator<JitFFI::SysV64::ArgumentList::Data>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       list.datalist.data.c.
       super__List_base<JitFFI::SysV64::ArgumentList::Data,_std::allocator<JitFFI::SysV64::ArgumentList::Data>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  if ((local_a8->retdata).type == '\n') {
    ArgumentList::push(&list,op_void,0);
  }
  list.retdata = local_a8->retdata;
  local_90 = &local_a8->typelist;
  uVar8 = 0;
  do {
    jfc_00 = local_98;
    if (uVar8 == local_a8->num) {
      local_58.super_JitFuncCallerCreaterX64.data = local_98;
      local_58.super_JitFuncCallerCreaterX64.push_count = 0;
      local_58.super_JitFuncCallerCreaterX64.sub_rsp_ptr = (byte *)0x0;
      local_58.super_JitFuncCallerCreaterX64.have_init = false;
      local_58.super_JitFuncCallerCreaterX64._28_4_ = 0;
      local_58.addarg_double_count = 0;
      create_function_caller_head(&local_58);
      OpCode_x64::mov_rx_rx(jfc_00,rbx,rdi);
      local_58.addarg_double_count = list.counter.float_count;
      local_58.super_JitFuncCallerCreaterX64._28_4_ = list.counter.int_count;
      local_58.super_JitFuncCallerCreaterX64.have_init = true;
      do {
        bVar3 = ArgumentList::get_next(&list,&type,&local_b0);
        if (!bVar3) {
          JitFuncCallerCreater::call(&local_58,local_a0);
          create_return(&local_58,&list.retdata);
          create_function_caller_foot(&local_58);
          std::__cxx11::
          _List_base<JitFFI::SysV64::ArgumentList::Data,_std::allocator<JitFFI::SysV64::ArgumentList::Data>_>
          ::_M_clear((_List_base<JitFFI::SysV64::ArgumentList::Data,_std::allocator<JitFFI::SysV64::ArgumentList::Data>_>
                      *)&list);
          return;
        }
        switch(type) {
        case op_void:
          break;
        case op_int:
          JitFuncCallerCreater::add_int(&local_58,local_b0);
          break;
        case op_float:
          JitFuncCallerCreater::add_double(&local_58,local_b0);
          break;
        case op_memory:
          JitFuncCallerCreaterX64::push(&local_58.super_JitFuncCallerCreaterX64,local_b0);
          break;
        default:
          printf("%d\n");
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                        ,0x338,
                        "void JitFFI::SysV64::create_argument(JitFuncCallerCreater &, ArgumentList &)"
                       );
        }
      } while( true );
    }
    pPVar4 = UPtrValVector<JitFFI::SysV64::ArgTypeInfo::PassData>::operator[](local_90,(ulong)uVar8)
    ;
    switch(pPVar4->op) {
    case '\x01':
      uVar5 = convert_uint64(p_Var7[1]._M_next,(ulong)pPVar4->size);
      op = op_int;
      goto LAB_00110397;
    case '\x02':
      uVar5 = convert_uint64(p_Var7[1]._M_next,(ulong)pPVar4->size);
      op = op_float;
LAB_00110397:
      ArgumentList::push(&list,op,uVar5);
      break;
    case '\x03':
      ArgumentList::push_memory(&list,p_Var7[1]._M_next,(ulong)pPVar4->size);
      break;
    case '\x04':
      uVar2 = pPVar4->size;
      if (0x10 < uVar2) {
        __assert_fail("size <= 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                      ,0x2f2,
                      "void JitFFI::SysV64::push_struct_data(ArgumentList &, const void *, const ArgTypeInfo::StructPassData &, unsigned int)"
                     );
      }
      uVar6 = (uint)uVar2;
      if (uVar2 != 0) {
        dat = p_Var7[1]._M_next;
        SVar1 = (pPVar4->spd).super_StructBaseData;
        n = 8;
        if (uVar6 < 8) {
          n = (size_t)uVar6;
        }
        uVar5 = convert_uint64(dat,n);
        ArgumentList::push(&list,(byte)SVar1 & 0xf,uVar5);
        if (8 < uVar2) {
          op = (byte)(pPVar4->spd).super_StructBaseData >> 4;
          uVar5 = convert_uint64(&dat->_M_prev,(ulong)(uVar6 - 8));
          goto LAB_00110397;
        }
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                    ,0x313,
                    "ArgumentList JitFFI::SysV64::create_argumentlist(const ArgTypeInfo &, const ArgDataList &)"
                   );
    }
    p_Var7 = p_Var7->_M_next;
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void CreateCaller(JitFuncCreater &jfc, const ArgumentInfo &argumentinfo, void *func, const ArgDataList &adlist)
		{
			assert(adlist.size() < UINT32_MAX);

			ArgumentList list = create_argumentlist(get_argtypeinfo(argumentinfo), adlist);

			//printf("<");
			//for (auto &e : list.list) {
			//	printf("(%d 0x%llX)\n", e.type, e.data);
			//}
			//printf(">\n");

			JitFuncCallerCreater jfcc(jfc);
			create_function_caller_head(jfcc);

			mov(jfc, rbx, rdi);
			create_argument(jfcc, list);

			jfcc.call(func);

			create_return(jfcc, list.get_retdata());

			create_function_caller_foot(jfcc);
		}